

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

int unescapestring(char *dst,char *src,char *end)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  
  iVar3 = (int)dst;
  if (src < end) {
    do {
      pcVar2 = src + 1;
      cVar1 = *src;
      if (cVar1 == '^') {
        if (end <= pcVar2) break;
        cVar1 = src[1];
        pcVar2 = src + 2;
        if (cVar1 == 'f') {
          cVar1 = '\f';
        }
        else if (cVar1 == 'n') {
          cVar1 = '\n';
        }
        else if (cVar1 == 't') {
          cVar1 = '\t';
        }
      }
      *dst = cVar1;
      dst = dst + 1;
      src = pcVar2;
    } while (pcVar2 < end);
  }
  return (int)dst - iVar3;
}

Assistant:

int unescapestring(char *dst, const char *src, const char *end)
{
    char *start = dst;
    while(src < end)
    {
        int c = *src++;
        if(c == '^')
        {
            if(src >= end) break;
            int e = *src++;
            switch(e)
            {
                case 'n': *dst++ = '\n'; break;
                case 't': *dst++ = '\t'; break;
                case 'f': *dst++ = '\f'; break;
                default: *dst++ = e; break;
            }
        }
        else *dst++ = c;
    }
    return dst - start;
}